

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::unrecognizedToken(SelectionCompiler *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"unrecognized token",&local_31);
  bVar1 = compileError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool unrecognizedToken() { return compileError("unrecognized token"); }